

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O0

string * __thiscall Tracker::logSamples(string *__return_storage_ptr__,Tracker *this,string *_track)

{
  ulong uVar1;
  bool bVar2;
  pointer ppVar3;
  size_type sVar4;
  reference pvVar5;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ulong local_70;
  size_t i;
  string track_name;
  allocator local_31;
  _Self local_30;
  _Self local_28;
  iterator it;
  string *_track_local;
  Tracker *this_local;
  string *log;
  
  it._M_node = (_Base_ptr)_track;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
       ::find(&this->m_data,_track);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
       ::end(&this->m_data);
  bVar2 = std::operator==(&local_28,&local_30);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else {
    track_name.field_2._M_local_buf[0xb] = '\0';
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"",
               (allocator *)(track_name.field_2._M_local_buf + 10));
    std::allocator<char>::~allocator((allocator<char> *)(track_name.field_2._M_local_buf + 10));
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>
             ::operator->(&local_28);
    std::__cxx11::string::string((string *)&i,(string *)ppVar3);
    local_70 = 0;
    while( true ) {
      uVar1 = local_70;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>
               ::operator->(&local_28);
      sVar4 = std::vector<StatSample,_std::allocator<StatSample>_>::size(&(ppVar3->second).samples);
      if (sVar4 <= uVar1) break;
      std::operator+(&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,",");
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>
               ::operator->(&local_28);
      pvVar5 = std::vector<StatSample,_std::allocator<StatSample>_>::operator[]
                         (&(ppVar3->second).samples,local_70);
      vera::toString<double>(&local_130,&pvVar5->startMs);
      std::operator+(&local_f0,&local_110,&local_130);
      std::operator+(&local_d0,&local_f0,",");
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>
               ::operator->(&local_28);
      pvVar5 = std::vector<StatSample,_std::allocator<StatSample>_>::operator[]
                         (&(ppVar3->second).samples,local_70);
      vera::toString<double>(&local_150,&pvVar5->durationMs);
      std::operator+(&local_b0,&local_d0,&local_150);
      std::operator+(&local_90,&local_b0,"\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      local_70 = local_70 + 1;
    }
    track_name.field_2._M_local_buf[0xb] = '\x01';
    std::__cxx11::string::~string((string *)&i);
    if ((track_name.field_2._M_local_buf[0xb] & 1U) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Tracker::logSamples(const std::string& _track) {
    std::map<std::string, StatTrack>::iterator it = m_data.find(_track);

    if ( it == m_data.end() )
        return "";

    std::string log = "";
    std::string track_name = it->first;
    
    for (size_t i = 0; i < it->second.samples.size(); i++)
        log +=  track_name + "," + 
                vera::toString(it->second.samples[i].startMs) + "," + 
                vera::toString(it->second.samples[i].durationMs) + "\n";

    return log;
}